

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM483I.h
# Opt level: O2

int SetMotorTorqueIM483I(IM483I *pIM483I,int holdpercent,int runpercent)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  char *__s;
  uint uVar5;
  int writebuflen;
  ulong uVar6;
  char recvbuf [512];
  char sendbuf [512];
  
  if (99 < holdpercent) {
    holdpercent = 100;
  }
  uVar4 = (ulong)(uint)holdpercent;
  if (holdpercent < 1) {
    uVar4 = 0;
  }
  uVar5 = 100;
  if (runpercent < 100) {
    uVar5 = runpercent;
  }
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = 0;
  }
  memset(sendbuf,0,0x200);
  sprintf(sendbuf,"Y %d %d\r",uVar4,uVar6);
  sVar2 = strlen(sendbuf);
  writebuflen = (int)sVar2;
  iVar1 = WriteDataIM483I(pIM483I,(uint8 *)sendbuf,writebuflen,pIM483I->bytedelayus);
  iVar3 = 1;
  if (iVar1 == 0) {
    if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
      fwrite(sendbuf,(long)writebuflen,1,(FILE *)pIM483I->pfSaveFile);
      fflush((FILE *)pIM483I->pfSaveFile);
    }
    mSleep(0x14);
    if (pIM483I->bCheckState == 0) {
      return 0;
    }
    memset(recvbuf,0,0x200);
    iVar1 = ReadAllRS232Port(&pIM483I->RS232Port,(uint8 *)recvbuf,writebuflen + 1);
    if (iVar1 == 0) {
      if ((pIM483I->bSaveRawData != 0) && ((FILE *)pIM483I->pfSaveFile != (FILE *)0x0)) {
        fwrite(recvbuf,(long)(writebuflen + 1),1,(FILE *)pIM483I->pfSaveFile);
        fflush((FILE *)pIM483I->pfSaveFile);
      }
      iVar1 = strncmp(recvbuf,sendbuf,(long)writebuflen);
      iVar3 = 4;
      __s = "Error reading data from a IM483I : Invalid data. ";
      if ((iVar1 == 0) && (recvbuf[writebuflen] == '\n')) {
        return 0;
      }
    }
    else {
      __s = "Error reading data from a IM483I. ";
    }
  }
  else {
    __s = "Error writing data to a IM483I. ";
  }
  puts(__s);
  return iVar3;
}

Assistant:

inline int SetMotorTorqueIM483I(IM483I* pIM483I, int holdpercent, int runpercent)
{
	char sendbuf[MAX_NB_BYTES_IM483I];
	int sendbuflen = 0;
	char recvbuf[MAX_NB_BYTES_IM483I];
	int recvbuflen = 0;

	holdpercent = max(min(holdpercent, 100), 0);
	runpercent = max(min(runpercent, 100), 0);

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "Y %d %d\r", holdpercent, runpercent);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataIM483I(pIM483I, (unsigned char*)sendbuf, sendbuflen, pIM483I->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a IM483I. \n");
		return EXIT_FAILURE;
	}
	if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pIM483I->pfSaveFile);
		fflush(pIM483I->pfSaveFile);
	}

	mSleep(20);

	if (pIM483I->bCheckState)
	{
		// Should echo and add \n...

		// Prepare the buffer that should receive data from the device.
		memset(recvbuf, 0, sizeof(recvbuf));
		recvbuflen = sendbuflen+1; // The last character must be a 0 to be a valid string for sscanf.

		if (ReadAllRS232Port(&pIM483I->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
		{
			printf("Error reading data from a IM483I. \n");
			return EXIT_FAILURE;
		}
		if ((pIM483I->bSaveRawData)&&(pIM483I->pfSaveFile))
		{
			fwrite(recvbuf, recvbuflen, 1, pIM483I->pfSaveFile);
			fflush(pIM483I->pfSaveFile);
		}

		// Display and analyze received data.
		//printf("Received : \"%s\"\n", recvbuf);
		if ((strncmp(recvbuf, sendbuf, sendbuflen) != 0)||(recvbuf[recvbuflen-1] != '\n'))
		{
			printf("Error reading data from a IM483I : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
	}

	return EXIT_SUCCESS;
}